

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_SymHash * new_D_SymHash(void)

{
  D_SymHash *__s;
  D_Sym **ppDVar1;
  D_SymHash *sh;
  
  __s = (D_SymHash *)malloc(0x30);
  memset(__s,0,0x30);
  __s->grow = 0x1883;
  (__s->syms).n = 0xc41;
  ppDVar1 = (D_Sym **)malloc((ulong)(__s->syms).n << 3);
  (__s->syms).v = ppDVar1;
  memset((__s->syms).v,0,(ulong)(__s->syms).n << 3);
  return __s;
}

Assistant:

static D_SymHash *new_D_SymHash(void) {
  D_SymHash *sh = MALLOC(sizeof(D_SymHash));
  memset(sh, 0, sizeof(D_SymHash));
  sh->grow = INITIAL_SYMHASH_SIZE * 2 + 1;
  sh->syms.n = INITIAL_SYMHASH_SIZE;
  sh->syms.v = MALLOC(sh->syms.n * sizeof(void *));
  memset(sh->syms.v, 0, sh->syms.n * sizeof(void *));
  return sh;
}